

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c0738::DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test::TestBody
          (DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test *this)

{
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  bool expect_output;
  AssertHelper local_b0;
  Message local_a8;
  int local_9c;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  local_60;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_30;
  pointer local_18;
  DeathTest *gtest_dt;
  DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test *this_local;
  
  gtest_dt = (DeathTest *)this;
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_00548cd7;
  ::(anonymous_namespace)::MatchOutput_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)0x0,expect_output);
  testing::internal::MakeDeathTestMatcher(&local_30,&local_48);
  bVar2 = testing::internal::DeathTest::Create
                    ("{ static google::protobuf::internal::NoopDebugCounter counter1; static google::protobuf::internal::NoopDebugCounter counter2; counter1.Inc(); counter2.Inc(); counter2.Inc(); exit(0); }"
                     ,&local_30,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
                     ,0x46,&local_18);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_30);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_48);
  if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00548cd7;
  if (local_18 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&local_60,local_18);
  iVar3 = (*local_18->_vptr_DeathTest[2])();
  pDVar1 = local_18;
  if (iVar3 == 0) {
    testing::ExitedWithCode::ExitedWithCode((ExitedWithCode *)((long)&gtest_sentinel.test_ + 4),0);
    iVar3 = (*local_18->_vptr_DeathTest[3])();
    bVar2 = testing::ExitedWithCode::operator()
                      ((ExitedWithCode *)((long)&gtest_sentinel.test_ + 4),iVar3);
    iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
    if ((((byte)iVar3 ^ 0xff) & 1) == 0) goto LAB_00548c9f;
    local_9c = 2;
  }
  else {
    if (iVar3 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                ((ReturnSentinel *)&gtest_exception,local_18);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        google::protobuf::internal::NoopDebugCounter::Inc
                  ((NoopDebugCounter *)
                   &::(anonymous_namespace)::DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test::
                    TestBody()::counter1);
        google::protobuf::internal::NoopDebugCounter::Inc
                  ((NoopDebugCounter *)
                   &::(anonymous_namespace)::DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test::
                    TestBody()::counter2);
        google::protobuf::internal::NoopDebugCounter::Inc
                  ((NoopDebugCounter *)
                   &::(anonymous_namespace)::DebugCounterTest_NoopDoesNotProvidesReportAtExit_Test::
                    TestBody()::counter2);
        exit(0);
      }
      (*local_18->_vptr_DeathTest[5])(local_18,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                ((ReturnSentinel *)&gtest_exception);
    }
LAB_00548c9f:
    local_9c = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr(&local_60);
  if (local_9c == 0) {
    return;
  }
LAB_00548cd7:
  testing::Message::Message(&local_a8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
             ,0x46,message);
  testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::Message::~Message(&local_a8);
  return;
}

Assistant:

TEST(DebugCounterTest, NoopDoesNotProvidesReportAtExit) {
  EXPECT_EXIT(
      {
        static google::protobuf::internal::NoopDebugCounter counter1;
        static google::protobuf::internal::NoopDebugCounter counter2;
        counter1.Inc();
        counter2.Inc();
        counter2.Inc();
        exit(0);
      },
      ExitedWithCode(0), MatchOutput(false));

  // and test that the operations have no side effects.
  static_assert((google::protobuf::internal::NoopDebugCounter().Inc(), true), "");
}